

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMvMBIntersectorKPluecker<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  undefined4 *puVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  RTCFilterFunctionN p_Var5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  byte bVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined4 uVar13;
  int iVar14;
  undefined4 uVar15;
  AABBNodeMB4D *node1;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  ulong uVar20;
  undefined1 (*pauVar21) [16];
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  undefined1 (*pauVar28) [16];
  ulong uVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [64];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar42 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [64];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [64];
  undefined1 auVar81 [16];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  float fVar84;
  float fVar88;
  float fVar89;
  float fVar90;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  undefined1 auVar95 [16];
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar121;
  float fVar122;
  float fVar123;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2831;
  long local_2830;
  undefined8 uStack_2828;
  undefined8 local_2820;
  float fStack_2818;
  float fStack_2814;
  ulong local_2808;
  size_t local_2800;
  RayHitK<8> *local_27f8;
  undefined1 local_27f0 [16];
  undefined1 local_27e0 [16];
  undefined1 local_27d0 [16];
  undefined1 local_27c0 [16];
  Scene *local_27b0;
  undefined8 uStack_27a8;
  undefined1 local_27a0 [16];
  long local_2790;
  ulong local_2788;
  RTCFilterFunctionNArguments local_2780;
  float local_2750;
  float fStack_274c;
  float fStack_2748;
  float fStack_2744;
  undefined1 local_2740 [16];
  undefined1 local_2730 [16];
  undefined1 *local_2720;
  undefined1 local_2710 [16];
  undefined1 local_2700 [16];
  undefined1 local_26f0 [16];
  undefined1 local_26e0 [16];
  undefined1 local_26d0 [16];
  undefined1 local_26c0 [16];
  undefined1 local_26b0 [16];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [16];
  undefined1 local_2650 [16];
  undefined1 local_2640 [16];
  undefined1 local_2630 [16];
  undefined1 local_2620 [16];
  undefined1 local_2610 [16];
  undefined1 local_2600 [32];
  float local_25e0;
  float fStack_25dc;
  float fStack_25d8;
  float fStack_25d4;
  float fStack_25d0;
  float fStack_25cc;
  float fStack_25c8;
  float fStack_25c4;
  float local_25c0;
  float fStack_25bc;
  float fStack_25b8;
  float fStack_25b4;
  float fStack_25b0;
  float fStack_25ac;
  float fStack_25a8;
  float fStack_25a4;
  float local_25a0;
  float fStack_259c;
  float fStack_2598;
  float fStack_2594;
  float fStack_2590;
  float fStack_258c;
  float fStack_2588;
  float fStack_2584;
  float local_2580;
  float fStack_257c;
  float fStack_2578;
  float fStack_2574;
  float fStack_2570;
  float fStack_256c;
  float fStack_2568;
  float fStack_2564;
  float local_2560;
  float fStack_255c;
  float fStack_2558;
  float fStack_2554;
  float fStack_2550;
  float fStack_254c;
  float fStack_2548;
  float fStack_2544;
  float local_2540;
  float fStack_253c;
  float fStack_2538;
  float fStack_2534;
  float fStack_2530;
  float fStack_252c;
  float fStack_2528;
  float fStack_2524;
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  RTCHitN local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined4 local_2460;
  undefined4 uStack_245c;
  undefined4 uStack_2458;
  undefined4 uStack_2454;
  undefined4 uStack_2450;
  undefined4 uStack_244c;
  undefined4 uStack_2448;
  undefined4 uStack_2444;
  undefined4 local_2440;
  undefined4 uStack_243c;
  undefined4 uStack_2438;
  undefined4 uStack_2434;
  undefined4 uStack_2430;
  undefined4 uStack_242c;
  undefined4 uStack_2428;
  undefined4 uStack_2424;
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  uint local_23e0;
  uint uStack_23dc;
  uint uStack_23d8;
  uint uStack_23d4;
  uint uStack_23d0;
  uint uStack_23cc;
  uint uStack_23c8;
  uint uStack_23c4;
  uint local_23c0;
  uint uStack_23bc;
  uint uStack_23b8;
  uint uStack_23b4;
  uint uStack_23b0;
  uint uStack_23ac;
  uint uStack_23a8;
  uint uStack_23a4;
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [48];
  undefined8 local_2360 [1126];
  ulong uVar19;
  
  pauVar28 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  uVar15 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_24e0._4_4_ = uVar15;
  local_24e0._0_4_ = uVar15;
  local_24e0._8_4_ = uVar15;
  local_24e0._12_4_ = uVar15;
  local_24e0._16_4_ = uVar15;
  local_24e0._20_4_ = uVar15;
  local_24e0._24_4_ = uVar15;
  local_24e0._28_4_ = uVar15;
  auVar80 = ZEXT3264(local_24e0);
  uVar15 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_2500._4_4_ = uVar15;
  local_2500._0_4_ = uVar15;
  local_2500._8_4_ = uVar15;
  local_2500._12_4_ = uVar15;
  local_2500._16_4_ = uVar15;
  local_2500._20_4_ = uVar15;
  local_2500._24_4_ = uVar15;
  local_2500._28_4_ = uVar15;
  auVar82 = ZEXT3264(local_2500);
  uVar15 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_2520._4_4_ = uVar15;
  local_2520._0_4_ = uVar15;
  local_2520._8_4_ = uVar15;
  local_2520._12_4_ = uVar15;
  local_2520._16_4_ = uVar15;
  local_2520._20_4_ = uVar15;
  local_2520._24_4_ = uVar15;
  local_2520._28_4_ = uVar15;
  auVar83 = ZEXT3264(local_2520);
  fVar105 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar118 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar127 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fVar84 = fVar105 * 0.99999964;
  fVar94 = fVar118 * 0.99999964;
  fVar98 = fVar127 * 0.99999964;
  fVar105 = fVar105 * 1.0000004;
  fVar118 = fVar118 * 1.0000004;
  fVar127 = fVar127 * 1.0000004;
  uVar27 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar26 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_2788 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  uVar29 = uVar27 ^ 0x20;
  iVar14 = (tray->tnear).field_0.i[k];
  local_26a0._4_4_ = iVar14;
  local_26a0._0_4_ = iVar14;
  local_26a0._8_4_ = iVar14;
  local_26a0._12_4_ = iVar14;
  local_26a0._16_4_ = iVar14;
  local_26a0._20_4_ = iVar14;
  local_26a0._24_4_ = iVar14;
  local_26a0._28_4_ = iVar14;
  auVar76 = ZEXT3264(local_26a0);
  uVar24 = local_2788 ^ 0x20;
  iVar14 = (tray->tfar).field_0.i[k];
  auVar35 = ZEXT3264(CONCAT428(iVar14,CONCAT424(iVar14,CONCAT420(iVar14,CONCAT416(iVar14,CONCAT412(
                                                  iVar14,CONCAT48(iVar14,CONCAT44(iVar14,iVar14)))))
                                               )));
  iVar14 = 1 << ((uint)k & 0x1f);
  auVar43._4_4_ = iVar14;
  auVar43._0_4_ = iVar14;
  auVar43._8_4_ = iVar14;
  auVar43._12_4_ = iVar14;
  auVar43._16_4_ = iVar14;
  auVar43._20_4_ = iVar14;
  auVar43._24_4_ = iVar14;
  auVar43._28_4_ = iVar14;
  auVar9 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar43 = vpand_avx2(auVar43,auVar9);
  local_2600 = vpcmpeqd_avx2(auVar43,auVar9);
  local_2540 = fVar84;
  fStack_253c = fVar84;
  fStack_2538 = fVar84;
  fStack_2534 = fVar84;
  fStack_2530 = fVar84;
  fStack_252c = fVar84;
  fStack_2528 = fVar84;
  fStack_2524 = fVar84;
  local_2560 = fVar94;
  fStack_255c = fVar94;
  fStack_2558 = fVar94;
  fStack_2554 = fVar94;
  fStack_2550 = fVar94;
  fStack_254c = fVar94;
  fStack_2548 = fVar94;
  fStack_2544 = fVar94;
  local_2580 = fVar98;
  fStack_257c = fVar98;
  fStack_2578 = fVar98;
  fStack_2574 = fVar98;
  fStack_2570 = fVar98;
  fStack_256c = fVar98;
  fStack_2568 = fVar98;
  fStack_2564 = fVar98;
  local_25a0 = fVar105;
  fStack_259c = fVar105;
  fStack_2598 = fVar105;
  fStack_2594 = fVar105;
  fStack_2590 = fVar105;
  fStack_258c = fVar105;
  fStack_2588 = fVar105;
  fStack_2584 = fVar105;
  local_25c0 = fVar118;
  fStack_25bc = fVar118;
  fStack_25b8 = fVar118;
  fStack_25b4 = fVar118;
  fStack_25b0 = fVar118;
  fStack_25ac = fVar118;
  fStack_25a8 = fVar118;
  fStack_25a4 = fVar118;
  local_25e0 = fVar127;
  fStack_25dc = fVar127;
  fStack_25d8 = fVar127;
  fStack_25d4 = fVar127;
  fStack_25d0 = fVar127;
  fStack_25cc = fVar127;
  fStack_25c8 = fVar127;
  fStack_25c4 = fVar127;
  fVar88 = fVar84;
  fVar89 = fVar84;
  fVar90 = fVar84;
  fVar91 = fVar84;
  fVar92 = fVar84;
  fVar93 = fVar84;
  fVar106 = fVar94;
  fVar110 = fVar94;
  fVar112 = fVar94;
  fVar114 = fVar94;
  fVar96 = fVar94;
  fVar97 = fVar94;
  fVar99 = fVar98;
  fVar100 = fVar98;
  fVar101 = fVar98;
  fVar102 = fVar98;
  fVar103 = fVar98;
  fVar104 = fVar98;
  fVar109 = fVar105;
  fVar111 = fVar105;
  fVar113 = fVar105;
  fVar115 = fVar105;
  fVar116 = fVar105;
  fVar117 = fVar105;
  fVar121 = fVar118;
  fVar122 = fVar118;
  fVar123 = fVar118;
  fVar124 = fVar118;
  fVar125 = fVar118;
  fVar126 = fVar118;
  fVar128 = fVar127;
  fVar129 = fVar127;
  fVar130 = fVar127;
  fVar131 = fVar127;
  fVar132 = fVar127;
  fVar133 = fVar127;
  local_2808 = uVar27;
  local_2800 = k;
  local_27f8 = ray;
LAB_016ce467:
  do {
    do {
      if (pauVar28 == (undefined1 (*) [16])&local_23a0) {
        return;
      }
      pauVar21 = pauVar28 + -1;
      pauVar28 = pauVar28 + -1;
    } while (*(float *)(ray + k * 4 + 0x100) < *(float *)(*pauVar21 + 8));
    uVar22 = *(ulong *)*pauVar28;
    while ((uVar22 & 8) == 0) {
      uVar15 = *(undefined4 *)(ray + k * 4 + 0xe0);
      auVar44._4_4_ = uVar15;
      auVar44._0_4_ = uVar15;
      auVar44._8_4_ = uVar15;
      auVar44._12_4_ = uVar15;
      auVar44._16_4_ = uVar15;
      auVar44._20_4_ = uVar15;
      auVar44._24_4_ = uVar15;
      auVar44._28_4_ = uVar15;
      uVar16 = uVar22 & 0xfffffffffffffff0;
      auVar36 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar16 + 0x100 + uVar27),auVar44,
                                *(undefined1 (*) [32])(uVar16 + 0x40 + uVar27));
      auVar43 = vsubps_avx(ZEXT1632(auVar36),auVar80._0_32_);
      auVar9._4_4_ = fVar88 * auVar43._4_4_;
      auVar9._0_4_ = fVar84 * auVar43._0_4_;
      auVar9._8_4_ = fVar89 * auVar43._8_4_;
      auVar9._12_4_ = fVar90 * auVar43._12_4_;
      auVar9._16_4_ = fVar91 * auVar43._16_4_;
      auVar9._20_4_ = fVar92 * auVar43._20_4_;
      auVar9._24_4_ = fVar93 * auVar43._24_4_;
      auVar9._28_4_ = auVar43._28_4_;
      auVar43 = vmaxps_avx(auVar76._0_32_,auVar9);
      auVar36 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar16 + 0x100 + uVar26),auVar44,
                                *(undefined1 (*) [32])(uVar16 + 0x40 + uVar26));
      auVar9 = vsubps_avx(ZEXT1632(auVar36),auVar82._0_32_);
      auVar7._4_4_ = fVar106 * auVar9._4_4_;
      auVar7._0_4_ = fVar94 * auVar9._0_4_;
      auVar7._8_4_ = fVar110 * auVar9._8_4_;
      auVar7._12_4_ = fVar112 * auVar9._12_4_;
      auVar7._16_4_ = fVar114 * auVar9._16_4_;
      auVar7._20_4_ = fVar96 * auVar9._20_4_;
      auVar7._24_4_ = fVar97 * auVar9._24_4_;
      auVar7._28_4_ = auVar9._28_4_;
      auVar36 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar16 + 0x100 + local_2788),auVar44,
                                *(undefined1 (*) [32])(uVar16 + 0x40 + local_2788));
      auVar9 = vsubps_avx(ZEXT1632(auVar36),auVar83._0_32_);
      auVar6._4_4_ = fVar99 * auVar9._4_4_;
      auVar6._0_4_ = fVar98 * auVar9._0_4_;
      auVar6._8_4_ = fVar100 * auVar9._8_4_;
      auVar6._12_4_ = fVar101 * auVar9._12_4_;
      auVar6._16_4_ = fVar102 * auVar9._16_4_;
      auVar6._20_4_ = fVar103 * auVar9._20_4_;
      auVar6._24_4_ = fVar104 * auVar9._24_4_;
      auVar6._28_4_ = auVar9._28_4_;
      auVar9 = vmaxps_avx(auVar7,auVar6);
      auVar9 = vmaxps_avx(auVar43,auVar9);
      auVar36 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar16 + 0x100 + uVar29),auVar44,
                                *(undefined1 (*) [32])(uVar16 + 0x40 + uVar29));
      auVar43 = vsubps_avx(ZEXT1632(auVar36),auVar80._0_32_);
      auVar10._4_4_ = fVar109 * auVar43._4_4_;
      auVar10._0_4_ = fVar105 * auVar43._0_4_;
      auVar10._8_4_ = fVar111 * auVar43._8_4_;
      auVar10._12_4_ = fVar113 * auVar43._12_4_;
      auVar10._16_4_ = fVar115 * auVar43._16_4_;
      auVar10._20_4_ = fVar116 * auVar43._20_4_;
      auVar10._24_4_ = fVar117 * auVar43._24_4_;
      auVar10._28_4_ = auVar43._28_4_;
      auVar43 = vminps_avx(auVar35._0_32_,auVar10);
      auVar36 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar16 + 0x100 + (uVar26 ^ 0x20)),auVar44,
                                *(undefined1 (*) [32])(uVar16 + 0x40 + (uVar26 ^ 0x20)));
      auVar7 = vsubps_avx(ZEXT1632(auVar36),auVar82._0_32_);
      auVar36 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar16 + 0x100 + uVar24),auVar44,
                                *(undefined1 (*) [32])(uVar16 + 0x40 + uVar24));
      auVar11._4_4_ = fVar121 * auVar7._4_4_;
      auVar11._0_4_ = fVar118 * auVar7._0_4_;
      auVar11._8_4_ = fVar122 * auVar7._8_4_;
      auVar11._12_4_ = fVar123 * auVar7._12_4_;
      auVar11._16_4_ = fVar124 * auVar7._16_4_;
      auVar11._20_4_ = fVar125 * auVar7._20_4_;
      auVar11._24_4_ = fVar126 * auVar7._24_4_;
      auVar11._28_4_ = auVar7._28_4_;
      auVar7 = vsubps_avx(ZEXT1632(auVar36),auVar83._0_32_);
      auVar12._4_4_ = fVar128 * auVar7._4_4_;
      auVar12._0_4_ = fVar127 * auVar7._0_4_;
      auVar12._8_4_ = fVar129 * auVar7._8_4_;
      auVar12._12_4_ = fVar130 * auVar7._12_4_;
      auVar12._16_4_ = fVar131 * auVar7._16_4_;
      auVar12._20_4_ = fVar132 * auVar7._20_4_;
      auVar12._24_4_ = fVar133 * auVar7._24_4_;
      auVar12._28_4_ = auVar7._28_4_;
      auVar7 = vminps_avx(auVar11,auVar12);
      auVar43 = vminps_avx(auVar43,auVar7);
      auVar43 = vcmpps_avx(auVar9,auVar43,2);
      if (((uint)uVar22 & 7) == 6) {
        auVar7 = vcmpps_avx(*(undefined1 (*) [32])(uVar16 + 0x1c0),auVar44,2);
        auVar6 = vcmpps_avx(auVar44,*(undefined1 (*) [32])(uVar16 + 0x1e0),1);
        auVar7 = vandps_avx(auVar7,auVar6);
        auVar43 = vandps_avx(auVar7,auVar43);
        auVar36 = vpackssdw_avx(auVar43._0_16_,auVar43._16_16_);
      }
      else {
        auVar36 = vpackssdw_avx(auVar43._0_16_,auVar43._16_16_);
      }
      auVar36 = vpsllw_avx(auVar36,0xf);
      local_24c0[0] = (RTCHitN)auVar9[0];
      local_24c0[1] = (RTCHitN)auVar9[1];
      local_24c0[2] = (RTCHitN)auVar9[2];
      local_24c0[3] = (RTCHitN)auVar9[3];
      local_24c0[4] = (RTCHitN)auVar9[4];
      local_24c0[5] = (RTCHitN)auVar9[5];
      local_24c0[6] = (RTCHitN)auVar9[6];
      local_24c0[7] = (RTCHitN)auVar9[7];
      local_24c0[8] = (RTCHitN)auVar9[8];
      local_24c0[9] = (RTCHitN)auVar9[9];
      local_24c0[10] = (RTCHitN)auVar9[10];
      local_24c0[0xb] = (RTCHitN)auVar9[0xb];
      local_24c0[0xc] = (RTCHitN)auVar9[0xc];
      local_24c0[0xd] = (RTCHitN)auVar9[0xd];
      local_24c0[0xe] = (RTCHitN)auVar9[0xe];
      local_24c0[0xf] = (RTCHitN)auVar9[0xf];
      local_24c0[0x10] = (RTCHitN)auVar9[0x10];
      local_24c0[0x11] = (RTCHitN)auVar9[0x11];
      local_24c0[0x12] = (RTCHitN)auVar9[0x12];
      local_24c0[0x13] = (RTCHitN)auVar9[0x13];
      local_24c0[0x14] = (RTCHitN)auVar9[0x14];
      local_24c0[0x15] = (RTCHitN)auVar9[0x15];
      local_24c0[0x16] = (RTCHitN)auVar9[0x16];
      local_24c0[0x17] = (RTCHitN)auVar9[0x17];
      local_24c0[0x18] = (RTCHitN)auVar9[0x18];
      local_24c0[0x19] = (RTCHitN)auVar9[0x19];
      local_24c0[0x1a] = (RTCHitN)auVar9[0x1a];
      local_24c0[0x1b] = (RTCHitN)auVar9[0x1b];
      local_24c0[0x1c] = (RTCHitN)auVar9[0x1c];
      local_24c0[0x1d] = (RTCHitN)auVar9[0x1d];
      local_24c0[0x1e] = (RTCHitN)auVar9[0x1e];
      local_24c0[0x1f] = (RTCHitN)auVar9[0x1f];
      if ((((((((auVar36 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar36 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar36 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar36 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar36 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar36 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar36 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar36[0xf])
      goto LAB_016ce467;
      auVar36 = vpacksswb_avx(auVar36,auVar36);
      bVar8 = SUB161(auVar36 >> 7,0) & 1 | (SUB161(auVar36 >> 0xf,0) & 1) << 1 |
              (SUB161(auVar36 >> 0x17,0) & 1) << 2 | (SUB161(auVar36 >> 0x1f,0) & 1) << 3 |
              (SUB161(auVar36 >> 0x27,0) & 1) << 4 | (SUB161(auVar36 >> 0x2f,0) & 1) << 5 |
              (SUB161(auVar36 >> 0x37,0) & 1) << 6 | SUB161(auVar36 >> 0x3f,0) << 7;
      lVar17 = 0;
      for (uVar22 = (ulong)bVar8; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
        lVar17 = lVar17 + 1;
      }
      uVar22 = *(ulong *)(uVar16 + lVar17 * 8);
      uVar18 = bVar8 - 1 & (uint)bVar8;
      uVar19 = (ulong)uVar18;
      if (uVar18 != 0) {
        uVar3 = *(uint *)(local_24c0 + lVar17 * 4);
        lVar17 = 0;
        for (; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
          lVar17 = lVar17 + 1;
        }
        uVar18 = uVar18 - 1 & uVar18;
        uVar20 = (ulong)uVar18;
        uVar19 = *(ulong *)(uVar16 + lVar17 * 8);
        uVar4 = *(uint *)(local_24c0 + lVar17 * 4);
        if (uVar18 == 0) {
          if (uVar3 < uVar4) {
            *(ulong *)*pauVar28 = uVar19;
            *(uint *)(*pauVar28 + 8) = uVar4;
            pauVar28 = pauVar28 + 1;
          }
          else {
            *(ulong *)*pauVar28 = uVar22;
            *(uint *)(*pauVar28 + 8) = uVar3;
            pauVar28 = pauVar28 + 1;
            uVar22 = uVar19;
          }
        }
        else {
          auVar36._8_8_ = 0;
          auVar36._0_8_ = uVar22;
          auVar36 = vpunpcklqdq_avx(auVar36,ZEXT416(uVar3));
          auVar46._8_8_ = 0;
          auVar46._0_8_ = uVar19;
          auVar46 = vpunpcklqdq_avx(auVar46,ZEXT416(uVar4));
          lVar17 = 0;
          for (; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
            lVar17 = lVar17 + 1;
          }
          uVar18 = uVar18 - 1 & uVar18;
          uVar22 = (ulong)uVar18;
          auVar54._8_8_ = 0;
          auVar54._0_8_ = *(ulong *)(uVar16 + lVar17 * 8);
          auVar37 = vpunpcklqdq_avx(auVar54,ZEXT416(*(uint *)(local_24c0 + lVar17 * 4)));
          auVar54 = vpcmpgtd_avx(auVar46,auVar36);
          if (uVar18 == 0) {
            auVar66 = vpshufd_avx(auVar54,0xaa);
            auVar54 = vblendvps_avx(auVar46,auVar36,auVar66);
            auVar36 = vblendvps_avx(auVar36,auVar46,auVar66);
            auVar46 = vpcmpgtd_avx(auVar37,auVar54);
            auVar66 = vpshufd_avx(auVar46,0xaa);
            auVar46 = vblendvps_avx(auVar37,auVar54,auVar66);
            auVar54 = vblendvps_avx(auVar54,auVar37,auVar66);
            auVar37 = vpcmpgtd_avx(auVar54,auVar36);
            auVar66 = vpshufd_avx(auVar37,0xaa);
            auVar37 = vblendvps_avx(auVar54,auVar36,auVar66);
            auVar36 = vblendvps_avx(auVar36,auVar54,auVar66);
            *pauVar28 = auVar36;
            pauVar28[1] = auVar37;
            uVar22 = auVar46._0_8_;
            pauVar28 = pauVar28 + 2;
          }
          else {
            lVar17 = 0;
            for (; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
              lVar17 = lVar17 + 1;
            }
            uVar18 = uVar18 - 1 & uVar18;
            uVar22 = (ulong)uVar18;
            auVar66._8_8_ = 0;
            auVar66._0_8_ = *(ulong *)(uVar16 + lVar17 * 8);
            auVar66 = vpunpcklqdq_avx(auVar66,ZEXT416(*(uint *)(local_24c0 + lVar17 * 4)));
            if (uVar18 == 0) {
              auVar39 = vpshufd_avx(auVar54,0xaa);
              auVar54 = vblendvps_avx(auVar46,auVar36,auVar39);
              auVar36 = vblendvps_avx(auVar36,auVar46,auVar39);
              auVar46 = vpcmpgtd_avx(auVar66,auVar37);
              auVar39 = vpshufd_avx(auVar46,0xaa);
              auVar46 = vblendvps_avx(auVar66,auVar37,auVar39);
              auVar37 = vblendvps_avx(auVar37,auVar66,auVar39);
              auVar66 = vpcmpgtd_avx(auVar37,auVar36);
              auVar39 = vpshufd_avx(auVar66,0xaa);
              auVar66 = vblendvps_avx(auVar37,auVar36,auVar39);
              auVar36 = vblendvps_avx(auVar36,auVar37,auVar39);
              auVar37 = vpcmpgtd_avx(auVar46,auVar54);
              auVar39 = vpshufd_avx(auVar37,0xaa);
              auVar37 = vblendvps_avx(auVar46,auVar54,auVar39);
              auVar46 = vblendvps_avx(auVar54,auVar46,auVar39);
              auVar54 = vpcmpgtd_avx(auVar66,auVar46);
              auVar39 = vpshufd_avx(auVar54,0xaa);
              auVar54 = vblendvps_avx(auVar66,auVar46,auVar39);
              auVar46 = vblendvps_avx(auVar46,auVar66,auVar39);
              *pauVar28 = auVar36;
              pauVar28[1] = auVar46;
              pauVar28[2] = auVar54;
              uVar22 = auVar37._0_8_;
              pauVar21 = pauVar28 + 3;
            }
            else {
              *pauVar28 = auVar36;
              pauVar28[1] = auVar46;
              pauVar28[2] = auVar37;
              pauVar21 = pauVar28 + 3;
              pauVar28[3] = auVar66;
              do {
                lVar17 = 0;
                for (uVar27 = uVar22; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000)
                {
                  lVar17 = lVar17 + 1;
                }
                auVar37._8_8_ = 0;
                auVar37._0_8_ = *(ulong *)(uVar16 + lVar17 * 8);
                auVar36 = vpunpcklqdq_avx(auVar37,ZEXT416(*(uint *)(local_24c0 + lVar17 * 4)));
                pauVar21[1] = auVar36;
                pauVar21 = pauVar21 + 1;
                uVar22 = uVar22 - 1 & uVar22;
              } while (uVar22 != 0);
              lVar17 = 0;
              while (pauVar21 != pauVar28) {
                uVar15 = *(undefined4 *)pauVar28[1];
                uVar2 = *(undefined4 *)(pauVar28[1] + 4);
                uVar18 = *(uint *)(pauVar28[1] + 8);
                uVar13 = *(undefined4 *)(pauVar28[1] + 0xc);
                for (lVar25 = 0x10;
                    (lVar17 != lVar25 && (*(uint *)(pauVar28[-1] + lVar25 + 8) < uVar18));
                    lVar25 = lVar25 + -0x10) {
                  *(undefined1 (*) [16])(*pauVar28 + lVar25) =
                       *(undefined1 (*) [16])(pauVar28[-1] + lVar25);
                }
                puVar1 = (undefined4 *)(*pauVar28 + lVar25);
                *puVar1 = uVar15;
                puVar1[1] = uVar2;
                puVar1[2] = uVar18;
                puVar1[3] = uVar13;
                lVar17 = lVar17 + -0x10;
                pauVar28 = pauVar28 + 1;
              }
              uVar22 = *(ulong *)*pauVar21;
              k = local_2800;
              ray = local_27f8;
              uVar27 = local_2808;
            }
            auVar76 = ZEXT3264(local_26a0);
            pauVar28 = pauVar21;
          }
        }
      }
    }
    local_2790 = (ulong)((uint)uVar22 & 0xf) - 8;
    uVar22 = uVar22 & 0xfffffffffffffff0;
    for (lVar17 = 0; lVar17 != local_2790; lVar17 = lVar17 + 1) {
      lVar25 = lVar17 * 0x140;
      uVar15 = *(undefined4 *)(ray + k * 4 + 0xe0);
      auVar58._4_4_ = uVar15;
      auVar58._0_4_ = uVar15;
      auVar58._8_4_ = uVar15;
      auVar58._12_4_ = uVar15;
      auVar36 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar22 + 0x90 + lVar25),auVar58,
                                *(undefined1 (*) [16])(uVar22 + lVar25));
      auVar46 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar22 + 0xa0 + lVar25),auVar58,
                                *(undefined1 (*) [16])(uVar22 + 0x10 + lVar25));
      auVar54 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar22 + 0xb0 + lVar25),auVar58,
                                *(undefined1 (*) [16])(uVar22 + 0x20 + lVar25));
      auVar37 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar22 + 0xc0 + lVar25),auVar58,
                                *(undefined1 (*) [16])(uVar22 + 0x30 + lVar25));
      auVar66 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar22 + 0xd0 + lVar25),auVar58,
                                *(undefined1 (*) [16])(uVar22 + 0x40 + lVar25));
      auVar39 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar22 + 0xe0 + lVar25),auVar58,
                                *(undefined1 (*) [16])(uVar22 + 0x50 + lVar25));
      auVar48 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar22 + 0xf0 + lVar25),auVar58,
                                *(undefined1 (*) [16])(uVar22 + 0x60 + lVar25));
      auVar40 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar22 + 0x100 + lVar25),auVar58,
                                *(undefined1 (*) [16])(uVar22 + 0x70 + lVar25));
      auVar58 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar22 + 0x110 + lVar25),auVar58,
                                *(undefined1 (*) [16])(uVar22 + 0x80 + lVar25));
      uVar15 = *(undefined4 *)(ray + k * 4);
      auVar59._4_4_ = uVar15;
      auVar59._0_4_ = uVar15;
      auVar59._8_4_ = uVar15;
      auVar59._12_4_ = uVar15;
      uVar15 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar107._4_4_ = uVar15;
      auVar107._0_4_ = uVar15;
      auVar107._8_4_ = uVar15;
      auVar107._12_4_ = uVar15;
      uVar15 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar119._4_4_ = uVar15;
      auVar119._0_4_ = uVar15;
      auVar119._8_4_ = uVar15;
      auVar119._12_4_ = uVar15;
      local_27c0 = vsubps_avx(auVar36,auVar59);
      local_27d0 = vsubps_avx(auVar46,auVar107);
      auVar36 = vsubps_avx(auVar54,auVar119);
      auVar46 = vsubps_avx(auVar37,auVar59);
      auVar54 = vsubps_avx(auVar66,auVar107);
      auVar37 = vsubps_avx(auVar39,auVar119);
      auVar66 = vsubps_avx(auVar48,auVar59);
      auVar39 = vsubps_avx(auVar40,auVar107);
      auVar48 = vsubps_avx(auVar58,auVar119);
      auVar40 = vsubps_avx(auVar66,local_27c0);
      local_2620 = vsubps_avx(auVar39,local_27d0);
      local_2610 = vsubps_avx(auVar48,auVar36);
      auVar30._0_4_ = auVar66._0_4_ + local_27c0._0_4_;
      auVar30._4_4_ = auVar66._4_4_ + local_27c0._4_4_;
      auVar30._8_4_ = auVar66._8_4_ + local_27c0._8_4_;
      auVar30._12_4_ = auVar66._12_4_ + local_27c0._12_4_;
      auVar55._0_4_ = auVar39._0_4_ + local_27d0._0_4_;
      auVar55._4_4_ = auVar39._4_4_ + local_27d0._4_4_;
      auVar55._8_4_ = auVar39._8_4_ + local_27d0._8_4_;
      auVar55._12_4_ = auVar39._12_4_ + local_27d0._12_4_;
      fVar105 = auVar36._0_4_;
      auVar60._0_4_ = auVar48._0_4_ + fVar105;
      fVar118 = auVar36._4_4_;
      auVar60._4_4_ = auVar48._4_4_ + fVar118;
      fVar127 = auVar36._8_4_;
      auVar60._8_4_ = auVar48._8_4_ + fVar127;
      fVar84 = auVar36._12_4_;
      auVar60._12_4_ = auVar48._12_4_ + fVar84;
      auVar108._0_4_ = auVar55._0_4_ * local_2610._0_4_;
      auVar108._4_4_ = auVar55._4_4_ * local_2610._4_4_;
      auVar108._8_4_ = auVar55._8_4_ * local_2610._8_4_;
      auVar108._12_4_ = auVar55._12_4_ * local_2610._12_4_;
      auVar59 = vfmsub231ps_fma(auVar108,local_2620,auVar60);
      auVar61._0_4_ = auVar60._0_4_ * auVar40._0_4_;
      auVar61._4_4_ = auVar60._4_4_ * auVar40._4_4_;
      auVar61._8_4_ = auVar60._8_4_ * auVar40._8_4_;
      auVar61._12_4_ = auVar60._12_4_ * auVar40._12_4_;
      auVar58 = vfmsub231ps_fma(auVar61,local_2610,auVar30);
      auVar31._0_4_ = local_2620._0_4_ * auVar30._0_4_;
      auVar31._4_4_ = local_2620._4_4_ * auVar30._4_4_;
      auVar31._8_4_ = local_2620._8_4_ * auVar30._8_4_;
      auVar31._12_4_ = local_2620._12_4_ * auVar30._12_4_;
      auVar30 = vfmsub231ps_fma(auVar31,auVar40,auVar55);
      local_2820._4_4_ = *(float *)(ray + k * 4 + 0xc0);
      auVar81._0_4_ = local_2820._4_4_ * auVar30._0_4_;
      auVar81._4_4_ = local_2820._4_4_ * auVar30._4_4_;
      auVar81._8_4_ = local_2820._4_4_ * auVar30._8_4_;
      auVar81._12_4_ = local_2820._4_4_ * auVar30._12_4_;
      uVar15 = *(undefined4 *)(ray + k * 4 + 0xa0);
      auVar95._4_4_ = uVar15;
      auVar95._0_4_ = uVar15;
      auVar95._8_4_ = uVar15;
      auVar95._12_4_ = uVar15;
      auVar58 = vfmadd231ps_fma(auVar81,auVar95,auVar58);
      uVar15 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar120._4_4_ = uVar15;
      auVar120._0_4_ = uVar15;
      auVar120._8_4_ = uVar15;
      auVar120._12_4_ = uVar15;
      local_2650 = vfmadd231ps_fma(auVar58,auVar120,auVar59);
      local_2630 = vsubps_avx(local_27d0,auVar54);
      local_2640 = vsubps_avx(auVar36,auVar37);
      auVar56._0_4_ = local_27d0._0_4_ + auVar54._0_4_;
      auVar56._4_4_ = local_27d0._4_4_ + auVar54._4_4_;
      auVar56._8_4_ = local_27d0._8_4_ + auVar54._8_4_;
      auVar56._12_4_ = local_27d0._12_4_ + auVar54._12_4_;
      auVar62._0_4_ = fVar105 + auVar37._0_4_;
      auVar62._4_4_ = fVar118 + auVar37._4_4_;
      auVar62._8_4_ = fVar127 + auVar37._8_4_;
      auVar62._12_4_ = fVar84 + auVar37._12_4_;
      fVar94 = local_2640._0_4_;
      auVar70._0_4_ = auVar56._0_4_ * fVar94;
      fVar88 = local_2640._4_4_;
      auVar70._4_4_ = auVar56._4_4_ * fVar88;
      fVar90 = local_2640._8_4_;
      auVar70._8_4_ = auVar56._8_4_ * fVar90;
      fVar92 = local_2640._12_4_;
      auVar70._12_4_ = auVar56._12_4_ * fVar92;
      auVar59 = vfmsub231ps_fma(auVar70,local_2630,auVar62);
      auVar58 = vsubps_avx(local_27c0,auVar46);
      fVar98 = auVar58._0_4_;
      auVar77._0_4_ = auVar62._0_4_ * fVar98;
      fVar89 = auVar58._4_4_;
      auVar77._4_4_ = auVar62._4_4_ * fVar89;
      fVar91 = auVar58._8_4_;
      auVar77._8_4_ = auVar62._8_4_ * fVar91;
      fVar93 = auVar58._12_4_;
      auVar77._12_4_ = auVar62._12_4_ * fVar93;
      auVar63._0_4_ = local_27c0._0_4_ + auVar46._0_4_;
      auVar63._4_4_ = local_27c0._4_4_ + auVar46._4_4_;
      auVar63._8_4_ = local_27c0._8_4_ + auVar46._8_4_;
      auVar63._12_4_ = local_27c0._12_4_ + auVar46._12_4_;
      auVar36 = vfmsub231ps_fma(auVar77,local_2640,auVar63);
      fVar106 = local_2630._0_4_;
      auVar64._0_4_ = fVar106 * auVar63._0_4_;
      fVar110 = local_2630._4_4_;
      auVar64._4_4_ = fVar110 * auVar63._4_4_;
      fVar112 = local_2630._8_4_;
      auVar64._8_4_ = fVar112 * auVar63._8_4_;
      fVar114 = local_2630._12_4_;
      auVar64._12_4_ = fVar114 * auVar63._12_4_;
      auVar30 = vfmsub231ps_fma(auVar64,auVar58,auVar56);
      auVar65._0_4_ = local_2820._4_4_ * auVar30._0_4_;
      auVar65._4_4_ = local_2820._4_4_ * auVar30._4_4_;
      auVar65._8_4_ = local_2820._4_4_ * auVar30._8_4_;
      auVar65._12_4_ = local_2820._4_4_ * auVar30._12_4_;
      auVar36 = vfmadd231ps_fma(auVar65,auVar95,auVar36);
      local_2740 = vfmadd231ps_fma(auVar36,auVar120,auVar59);
      auVar59 = vsubps_avx(auVar46,auVar66);
      auVar47._0_4_ = auVar46._0_4_ + auVar66._0_4_;
      auVar47._4_4_ = auVar46._4_4_ + auVar66._4_4_;
      auVar47._8_4_ = auVar46._8_4_ + auVar66._8_4_;
      auVar47._12_4_ = auVar46._12_4_ + auVar66._12_4_;
      auVar66 = vsubps_avx(auVar54,auVar39);
      auVar38._0_4_ = auVar54._0_4_ + auVar39._0_4_;
      auVar38._4_4_ = auVar54._4_4_ + auVar39._4_4_;
      auVar38._8_4_ = auVar54._8_4_ + auVar39._8_4_;
      auVar38._12_4_ = auVar54._12_4_ + auVar39._12_4_;
      auVar54 = vsubps_avx(auVar37,auVar48);
      auVar67._0_4_ = auVar37._0_4_ + auVar48._0_4_;
      auVar67._4_4_ = auVar37._4_4_ + auVar48._4_4_;
      auVar67._8_4_ = auVar37._8_4_ + auVar48._8_4_;
      auVar67._12_4_ = auVar37._12_4_ + auVar48._12_4_;
      auVar71._0_4_ = auVar54._0_4_ * auVar38._0_4_;
      auVar71._4_4_ = auVar54._4_4_ * auVar38._4_4_;
      auVar71._8_4_ = auVar54._8_4_ * auVar38._8_4_;
      auVar71._12_4_ = auVar54._12_4_ * auVar38._12_4_;
      auVar46 = vfmsub231ps_fma(auVar71,auVar66,auVar67);
      auVar68._0_4_ = auVar67._0_4_ * auVar59._0_4_;
      auVar68._4_4_ = auVar67._4_4_ * auVar59._4_4_;
      auVar68._8_4_ = auVar67._8_4_ * auVar59._8_4_;
      auVar68._12_4_ = auVar67._12_4_ * auVar59._12_4_;
      auVar36 = vfmsub231ps_fma(auVar68,auVar54,auVar47);
      auVar48._0_4_ = auVar66._0_4_ * auVar47._0_4_;
      auVar48._4_4_ = auVar66._4_4_ * auVar47._4_4_;
      auVar48._8_4_ = auVar66._8_4_ * auVar47._8_4_;
      auVar48._12_4_ = auVar66._12_4_ * auVar47._12_4_;
      auVar37 = vfmsub231ps_fma(auVar48,auVar59,auVar38);
      local_2820._0_4_ = local_2820._4_4_;
      fStack_2818 = local_2820._4_4_;
      fStack_2814 = local_2820._4_4_;
      auVar49._0_4_ = local_2820._4_4_ * auVar37._0_4_;
      auVar49._4_4_ = local_2820._4_4_ * auVar37._4_4_;
      auVar49._8_4_ = local_2820._4_4_ * auVar37._8_4_;
      auVar49._12_4_ = local_2820._4_4_ * auVar37._12_4_;
      auVar36 = vfmadd231ps_fma(auVar49,auVar95,auVar36);
      auVar37 = vfmadd231ps_fma(auVar36,auVar120,auVar46);
      local_2750 = local_2650._0_4_;
      fStack_274c = local_2650._4_4_;
      fStack_2748 = local_2650._8_4_;
      fStack_2744 = local_2650._12_4_;
      local_2730._0_4_ = auVar37._0_4_ + local_2750 + local_2740._0_4_;
      local_2730._4_4_ = auVar37._4_4_ + fStack_274c + local_2740._4_4_;
      local_2730._8_4_ = auVar37._8_4_ + fStack_2748 + local_2740._8_4_;
      local_2730._12_4_ = auVar37._12_4_ + fStack_2744 + local_2740._12_4_;
      auVar39._8_4_ = 0x7fffffff;
      auVar39._0_8_ = 0x7fffffff7fffffff;
      auVar39._12_4_ = 0x7fffffff;
      auVar36 = vminps_avx(local_2650,local_2740);
      auVar36 = vminps_avx(auVar36,auVar37);
      local_2660 = vandps_avx(local_2730,auVar39);
      auVar78._0_4_ = local_2660._0_4_ * 1.1920929e-07;
      auVar78._4_4_ = local_2660._4_4_ * 1.1920929e-07;
      auVar78._8_4_ = local_2660._8_4_ * 1.1920929e-07;
      auVar78._12_4_ = local_2660._12_4_ * 1.1920929e-07;
      uVar16 = CONCAT44(auVar78._4_4_,auVar78._0_4_);
      auVar72._0_8_ = uVar16 ^ 0x8000000080000000;
      auVar72._8_4_ = -auVar78._8_4_;
      auVar72._12_4_ = -auVar78._12_4_;
      auVar36 = vcmpps_avx(auVar36,auVar72,5);
      auVar46 = vmaxps_avx(local_2650,local_2740);
      auVar46 = vmaxps_avx(auVar46,auVar37);
      auVar46 = vcmpps_avx(auVar46,auVar78,2);
      auVar36 = vorps_avx(auVar36,auVar46);
      if ((((auVar36 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar36 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar36 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar36[0xf] < '\0'
         ) {
        auVar50._0_4_ = local_2610._0_4_ * fVar106;
        auVar50._4_4_ = local_2610._4_4_ * fVar110;
        auVar50._8_4_ = local_2610._8_4_ * fVar112;
        auVar50._12_4_ = local_2610._12_4_ * fVar114;
        auVar73._0_4_ = fVar98 * local_2620._0_4_;
        auVar73._4_4_ = fVar89 * local_2620._4_4_;
        auVar73._8_4_ = fVar91 * local_2620._8_4_;
        auVar73._12_4_ = fVar93 * local_2620._12_4_;
        auVar37 = vfmsub213ps_fma(local_2620,local_2640,auVar50);
        auVar69._0_4_ = auVar66._0_4_ * fVar94;
        auVar69._4_4_ = auVar66._4_4_ * fVar88;
        auVar69._8_4_ = auVar66._8_4_ * fVar90;
        auVar69._12_4_ = auVar66._12_4_ * fVar92;
        auVar79._0_4_ = fVar98 * auVar54._0_4_;
        auVar79._4_4_ = fVar89 * auVar54._4_4_;
        auVar79._8_4_ = fVar91 * auVar54._8_4_;
        auVar79._12_4_ = fVar93 * auVar54._12_4_;
        auVar48 = vfmsub213ps_fma(auVar54,local_2630,auVar69);
        auVar46 = vandps_avx(auVar50,auVar39);
        auVar54 = vandps_avx(auVar69,auVar39);
        auVar46 = vcmpps_avx(auVar46,auVar54,1);
        local_26d0 = vblendvps_avx(auVar48,auVar37,auVar46);
        auVar85._0_4_ = auVar59._0_4_ * fVar106;
        auVar85._4_4_ = auVar59._4_4_ * fVar110;
        auVar85._8_4_ = auVar59._8_4_ * fVar112;
        auVar85._12_4_ = auVar59._12_4_ * fVar114;
        auVar37 = vfmsub213ps_fma(auVar59,local_2640,auVar79);
        auVar51._0_4_ = auVar40._0_4_ * fVar94;
        auVar51._4_4_ = auVar40._4_4_ * fVar88;
        auVar51._8_4_ = auVar40._8_4_ * fVar90;
        auVar51._12_4_ = auVar40._12_4_ * fVar92;
        auVar48 = vfmsub213ps_fma(local_2610,auVar58,auVar51);
        auVar46 = vandps_avx(auVar51,auVar39);
        auVar54 = vandps_avx(auVar79,auVar39);
        auVar46 = vcmpps_avx(auVar46,auVar54,1);
        local_26c0 = vblendvps_avx(auVar37,auVar48,auVar46);
        auVar37 = vfmsub213ps_fma(auVar40,local_2630,auVar73);
        auVar66 = vfmsub213ps_fma(auVar66,auVar58,auVar85);
        auVar46 = vandps_avx(auVar73,auVar39);
        auVar54 = vandps_avx(auVar85,auVar39);
        auVar46 = vcmpps_avx(auVar46,auVar54,1);
        local_26b0 = vblendvps_avx(auVar66,auVar37,auVar46);
        auVar40._0_4_ = local_26b0._0_4_ * local_2820._4_4_;
        auVar40._4_4_ = local_26b0._4_4_ * local_2820._4_4_;
        auVar40._8_4_ = local_26b0._8_4_ * local_2820._4_4_;
        auVar40._12_4_ = local_26b0._12_4_ * local_2820._4_4_;
        auVar46 = vfmadd213ps_fma(auVar95,local_26c0,auVar40);
        auVar46 = vfmadd213ps_fma(auVar120,local_26d0,auVar46);
        auVar41._0_4_ = auVar46._0_4_ + auVar46._0_4_;
        auVar41._4_4_ = auVar46._4_4_ + auVar46._4_4_;
        auVar41._8_4_ = auVar46._8_4_ + auVar46._8_4_;
        auVar41._12_4_ = auVar46._12_4_ + auVar46._12_4_;
        auVar74._0_4_ = local_26b0._0_4_ * fVar105;
        auVar74._4_4_ = local_26b0._4_4_ * fVar118;
        auVar74._8_4_ = local_26b0._8_4_ * fVar127;
        auVar74._12_4_ = local_26b0._12_4_ * fVar84;
        auVar46 = vfmadd213ps_fma(local_27d0,local_26c0,auVar74);
        auVar54 = vfmadd213ps_fma(local_27c0,local_26d0,auVar46);
        auVar46 = vrcpps_avx(auVar41);
        auVar86._8_4_ = 0x3f800000;
        auVar86._0_8_ = 0x3f8000003f800000;
        auVar86._12_4_ = 0x3f800000;
        auVar37 = vfnmadd213ps_fma(auVar46,auVar41,auVar86);
        auVar46 = vfmadd132ps_fma(auVar37,auVar46,auVar46);
        local_26e0._0_4_ = auVar46._0_4_ * (auVar54._0_4_ + auVar54._0_4_);
        local_26e0._4_4_ = auVar46._4_4_ * (auVar54._4_4_ + auVar54._4_4_);
        local_26e0._8_4_ = auVar46._8_4_ * (auVar54._8_4_ + auVar54._8_4_);
        local_26e0._12_4_ = auVar46._12_4_ * (auVar54._12_4_ + auVar54._12_4_);
        auVar35 = ZEXT1664(local_26e0);
        uVar15 = *(undefined4 *)(ray + k * 4 + 0x60);
        auVar75._4_4_ = uVar15;
        auVar75._0_4_ = uVar15;
        auVar75._8_4_ = uVar15;
        auVar75._12_4_ = uVar15;
        auVar46 = vcmpps_avx(auVar75,local_26e0,2);
        uVar15 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar87._4_4_ = uVar15;
        auVar87._0_4_ = uVar15;
        auVar87._8_4_ = uVar15;
        auVar87._12_4_ = uVar15;
        auVar76 = ZEXT1664(auVar87);
        auVar54 = vcmpps_avx(local_26e0,auVar87,2);
        auVar46 = vandps_avx(auVar46,auVar54);
        auVar37 = auVar36 & auVar46;
        if ((((auVar37 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar37 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar37 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar37[0xf] < '\0') {
          auVar36 = vandps_avx(auVar36,auVar46);
          auVar46 = vcmpps_avx(auVar41,_DAT_01f45a50,4);
          auVar37 = auVar46 & auVar36;
          if ((((auVar37 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar37 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar37 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar37[0xf] < '\0') {
            local_27a0 = vandps_avx(auVar36,auVar46);
            local_2720 = &local_2831;
            uStack_27a8 = auVar120._8_8_;
            local_27b0 = context->scene;
            auVar36 = vrcpps_avx(local_2730);
            auVar57._8_4_ = 0x3f800000;
            auVar57._0_8_ = 0x3f8000003f800000;
            auVar57._12_4_ = 0x3f800000;
            auVar46 = vfnmadd213ps_fma(local_2730,auVar36,auVar57);
            auVar46 = vfmadd132ps_fma(auVar46,auVar36,auVar36);
            auVar52._8_4_ = 0x219392ef;
            auVar52._0_8_ = 0x219392ef219392ef;
            auVar52._12_4_ = 0x219392ef;
            auVar36 = vcmpps_avx(local_2660,auVar52,5);
            auVar36 = vandps_avx(auVar46,auVar36);
            auVar32._0_4_ = local_2750 * auVar36._0_4_;
            auVar32._4_4_ = fStack_274c * auVar36._4_4_;
            auVar32._8_4_ = fStack_2748 * auVar36._8_4_;
            auVar32._12_4_ = fStack_2744 * auVar36._12_4_;
            local_2700 = vminps_avx(auVar32,auVar57);
            auVar33._0_4_ = auVar36._0_4_ * local_2740._0_4_;
            auVar33._4_4_ = auVar36._4_4_ * local_2740._4_4_;
            auVar33._8_4_ = auVar36._8_4_ * local_2740._8_4_;
            auVar33._12_4_ = auVar36._12_4_ * local_2740._12_4_;
            local_26f0 = vminps_avx(auVar33,auVar57);
            auVar53._8_4_ = 0x7f800000;
            auVar53._0_8_ = 0x7f8000007f800000;
            auVar53._12_4_ = 0x7f800000;
            auVar36 = vblendvps_avx(auVar53,local_26e0,local_27a0);
            auVar46 = vshufps_avx(auVar36,auVar36,0xb1);
            auVar46 = vminps_avx(auVar46,auVar36);
            auVar37 = vshufpd_avx(auVar46,auVar46,1);
            auVar46 = vminps_avx(auVar37,auVar46);
            auVar36 = vcmpps_avx(auVar36,auVar46,0);
            auVar37 = local_27a0 & auVar36;
            auVar46 = vpcmpeqd_avx(auVar46,auVar46);
            if ((((auVar37 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar37 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar37 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar37[0xf] < '\0') {
              auVar46 = auVar36;
            }
            lVar25 = lVar25 + uVar22;
            auVar36 = vandps_avx(local_27a0,auVar46);
            uVar15 = vmovmskps_avx(auVar36);
            lVar23 = 0;
            for (uVar16 = CONCAT44((int)((ulong)context->scene >> 0x20),uVar15); (uVar16 & 1) == 0;
                uVar16 = uVar16 >> 1 | 0x8000000000000000) {
              lVar23 = lVar23 + 1;
            }
            auVar43 = vpcmpeqd_avx2(ZEXT1632(auVar54),ZEXT1632(auVar54));
            auVar80 = ZEXT3264(auVar43);
            uStack_2828 = auVar95._8_8_;
            local_2830 = lVar25;
            local_2710 = local_27a0;
            do {
              uVar18 = *(uint *)(lVar25 + 0x120 + lVar23 * 4);
              uVar16 = (ulong)uVar18;
              lVar25 = *(long *)(*(long *)((long)local_27b0 + 0x1e8) + uVar16 * 8);
              local_2820 = lVar25;
              if ((*(uint *)(lVar25 + 0x34) & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                *(undefined4 *)(local_27a0 + lVar23 * 4) = 0;
                lVar25 = local_2830;
              }
              else {
                local_27c0._0_8_ = lVar23;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (*(long *)(lVar25 + 0x40) == 0)) {
                  uVar15 = *(undefined4 *)(local_2700 + lVar23 * 4);
                  uVar2 = *(undefined4 *)(local_26f0 + lVar23 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_26e0 + lVar23 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_26d0 + lVar23 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_26c0 + lVar23 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_26b0 + lVar23 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar15;
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar2;
                  *(undefined4 *)(ray + k * 4 + 0x220) =
                       *(undefined4 *)(local_2830 + 0x130 + lVar23 * 4);
                  *(uint *)(ray + k * 4 + 0x240) = uVar18;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  break;
                }
                local_2460 = *(undefined4 *)(local_2700 + lVar23 * 4);
                local_2440 = *(undefined4 *)(local_26f0 + lVar23 * 4);
                uVar15 = *(undefined4 *)(local_2830 + 0x130 + lVar23 * 4);
                local_2420._4_4_ = uVar15;
                local_2420._0_4_ = uVar15;
                local_2420._8_4_ = uVar15;
                local_2420._12_4_ = uVar15;
                local_2420._16_4_ = uVar15;
                local_2420._20_4_ = uVar15;
                local_2420._24_4_ = uVar15;
                local_2420._28_4_ = uVar15;
                uVar15 = *(undefined4 *)(local_26d0 + lVar23 * 4);
                uVar2 = *(undefined4 *)(local_26c0 + lVar23 * 4);
                local_24a0._4_4_ = uVar2;
                local_24a0._0_4_ = uVar2;
                local_24a0._8_4_ = uVar2;
                local_24a0._12_4_ = uVar2;
                local_24a0._16_4_ = uVar2;
                local_24a0._20_4_ = uVar2;
                local_24a0._24_4_ = uVar2;
                local_24a0._28_4_ = uVar2;
                uVar2 = *(undefined4 *)(local_26b0 + lVar23 * 4);
                local_2480._4_4_ = uVar2;
                local_2480._0_4_ = uVar2;
                local_2480._8_4_ = uVar2;
                local_2480._12_4_ = uVar2;
                local_2480._16_4_ = uVar2;
                local_2480._20_4_ = uVar2;
                local_2480._24_4_ = uVar2;
                local_2480._28_4_ = uVar2;
                local_2400._4_4_ = uVar18;
                local_2400._0_4_ = uVar18;
                local_2400._8_4_ = uVar18;
                local_2400._12_4_ = uVar18;
                local_2400._16_4_ = uVar18;
                local_2400._20_4_ = uVar18;
                local_2400._24_4_ = uVar18;
                local_2400._28_4_ = uVar18;
                local_24c0[0] = (RTCHitN)(char)uVar15;
                local_24c0[1] = (RTCHitN)(char)((uint)uVar15 >> 8);
                local_24c0[2] = (RTCHitN)(char)((uint)uVar15 >> 0x10);
                local_24c0[3] = (RTCHitN)(char)((uint)uVar15 >> 0x18);
                local_24c0[4] = (RTCHitN)(char)uVar15;
                local_24c0[5] = (RTCHitN)(char)((uint)uVar15 >> 8);
                local_24c0[6] = (RTCHitN)(char)((uint)uVar15 >> 0x10);
                local_24c0[7] = (RTCHitN)(char)((uint)uVar15 >> 0x18);
                local_24c0[8] = (RTCHitN)(char)uVar15;
                local_24c0[9] = (RTCHitN)(char)((uint)uVar15 >> 8);
                local_24c0[10] = (RTCHitN)(char)((uint)uVar15 >> 0x10);
                local_24c0[0xb] = (RTCHitN)(char)((uint)uVar15 >> 0x18);
                local_24c0[0xc] = (RTCHitN)(char)uVar15;
                local_24c0[0xd] = (RTCHitN)(char)((uint)uVar15 >> 8);
                local_24c0[0xe] = (RTCHitN)(char)((uint)uVar15 >> 0x10);
                local_24c0[0xf] = (RTCHitN)(char)((uint)uVar15 >> 0x18);
                local_24c0[0x10] = (RTCHitN)(char)uVar15;
                local_24c0[0x11] = (RTCHitN)(char)((uint)uVar15 >> 8);
                local_24c0[0x12] = (RTCHitN)(char)((uint)uVar15 >> 0x10);
                local_24c0[0x13] = (RTCHitN)(char)((uint)uVar15 >> 0x18);
                local_24c0[0x14] = (RTCHitN)(char)uVar15;
                local_24c0[0x15] = (RTCHitN)(char)((uint)uVar15 >> 8);
                local_24c0[0x16] = (RTCHitN)(char)((uint)uVar15 >> 0x10);
                local_24c0[0x17] = (RTCHitN)(char)((uint)uVar15 >> 0x18);
                local_24c0[0x18] = (RTCHitN)(char)uVar15;
                local_24c0[0x19] = (RTCHitN)(char)((uint)uVar15 >> 8);
                local_24c0[0x1a] = (RTCHitN)(char)((uint)uVar15 >> 0x10);
                local_24c0[0x1b] = (RTCHitN)(char)((uint)uVar15 >> 0x18);
                local_24c0[0x1c] = (RTCHitN)(char)uVar15;
                local_24c0[0x1d] = (RTCHitN)(char)((uint)uVar15 >> 8);
                local_24c0[0x1e] = (RTCHitN)(char)((uint)uVar15 >> 0x10);
                local_24c0[0x1f] = (RTCHitN)(char)((uint)uVar15 >> 0x18);
                uStack_245c = local_2460;
                uStack_2458 = local_2460;
                uStack_2454 = local_2460;
                uStack_2450 = local_2460;
                uStack_244c = local_2460;
                uStack_2448 = local_2460;
                uStack_2444 = local_2460;
                uStack_243c = local_2440;
                uStack_2438 = local_2440;
                uStack_2434 = local_2440;
                uStack_2430 = local_2440;
                uStack_242c = local_2440;
                uStack_2428 = local_2440;
                uStack_2424 = local_2440;
                uStack_23dc = context->user->instID[0];
                local_23e0 = uStack_23dc;
                uStack_23d8 = uStack_23dc;
                uStack_23d4 = uStack_23dc;
                uStack_23d0 = uStack_23dc;
                uStack_23cc = uStack_23dc;
                uStack_23c8 = uStack_23dc;
                uStack_23c4 = uStack_23dc;
                uStack_23bc = context->user->instPrimID[0];
                local_23c0 = uStack_23bc;
                uStack_23b8 = uStack_23bc;
                uStack_23b4 = uStack_23bc;
                uStack_23b0 = uStack_23bc;
                uStack_23ac = uStack_23bc;
                uStack_23a8 = uStack_23bc;
                uStack_23a4 = uStack_23bc;
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_26e0 + lVar23 * 4);
                local_2680 = local_2600;
                local_2780.valid = (int *)local_2680;
                local_2780.geometryUserPtr = *(void **)(lVar25 + 0x18);
                local_2780.context = context->user;
                local_2780.hit = local_24c0;
                local_2780.N = 8;
                local_2780.ray = (RTCRayN *)ray;
                if (*(code **)(lVar25 + 0x40) != (code *)0x0) {
                  local_27d0._0_8_ = lVar17;
                  local_27e0 = auVar35._0_16_;
                  local_27f0 = auVar76._0_16_;
                  auVar43 = ZEXT1632(auVar80._0_16_);
                  (**(code **)(lVar25 + 0x40))(&local_2780);
                  auVar76 = ZEXT1664(local_27f0);
                  auVar35 = ZEXT1664(local_27e0);
                  auVar43 = vpcmpeqd_avx2(auVar43,auVar43);
                  auVar80 = ZEXT3264(auVar43);
                  lVar17 = local_27d0._0_8_;
                  k = local_2800;
                  ray = local_27f8;
                  uVar27 = local_2808;
                }
                auVar9 = vpcmpeqd_avx2(local_2680,_DAT_01f7b000);
                auVar43 = auVar80._0_32_ & ~auVar9;
                if ((((((((auVar43 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar43 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar43 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar43 >> 0x7f,0) == '\0') &&
                      (auVar43 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar43 >> 0xbf,0) == '\0') &&
                    (auVar43 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar43[0x1f]) {
                  auVar9 = auVar9 ^ auVar80._0_32_;
                }
                else {
                  p_Var5 = context->args->filter;
                  if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || ((*(byte *)(local_2820 + 0x3e) & 0x40) != 0)
                      ))) {
                    local_27d0._0_8_ = lVar17;
                    local_27e0 = auVar35._0_16_;
                    local_27f0 = auVar76._0_16_;
                    auVar43 = ZEXT1632(auVar80._0_16_);
                    (*p_Var5)(&local_2780);
                    auVar76 = ZEXT1664(local_27f0);
                    auVar35 = ZEXT1664(local_27e0);
                    auVar43 = vpcmpeqd_avx2(auVar43,auVar43);
                    auVar80 = ZEXT3264(auVar43);
                    lVar17 = local_27d0._0_8_;
                    k = local_2800;
                    ray = local_27f8;
                    uVar27 = local_2808;
                  }
                  auVar7 = vpcmpeqd_avx2(local_2680,_DAT_01f7b000);
                  auVar9 = auVar7 ^ auVar80._0_32_;
                  auVar43 = auVar80._0_32_ & ~auVar7;
                  if ((((((((auVar43 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar43 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar43 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar43 >> 0x7f,0) != '\0') ||
                        (auVar43 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar43 >> 0xbf,0) != '\0') ||
                      (auVar43 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar43[0x1f] < '\0') {
                    auVar45._0_4_ = auVar7._0_4_ ^ auVar80._0_4_;
                    auVar45._4_4_ = auVar7._4_4_ ^ auVar80._4_4_;
                    auVar45._8_4_ = auVar7._8_4_ ^ auVar80._8_4_;
                    auVar45._12_4_ = auVar7._12_4_ ^ auVar80._12_4_;
                    auVar45._16_4_ = auVar7._16_4_ ^ auVar80._16_4_;
                    auVar45._20_4_ = auVar7._20_4_ ^ auVar80._20_4_;
                    auVar45._24_4_ = auVar7._24_4_ ^ auVar80._24_4_;
                    auVar45._28_4_ = auVar7._28_4_ ^ auVar80._28_4_;
                    auVar43 = vmaskmovps_avx(auVar45,*(undefined1 (*) [32])local_2780.hit);
                    *(undefined1 (*) [32])(local_2780.ray + 0x180) = auVar43;
                    auVar43 = vmaskmovps_avx(auVar45,*(undefined1 (*) [32])(local_2780.hit + 0x20));
                    *(undefined1 (*) [32])(local_2780.ray + 0x1a0) = auVar43;
                    auVar43 = vmaskmovps_avx(auVar45,*(undefined1 (*) [32])(local_2780.hit + 0x40));
                    *(undefined1 (*) [32])(local_2780.ray + 0x1c0) = auVar43;
                    auVar43 = vmaskmovps_avx(auVar45,*(undefined1 (*) [32])(local_2780.hit + 0x60));
                    *(undefined1 (*) [32])(local_2780.ray + 0x1e0) = auVar43;
                    auVar43 = vmaskmovps_avx(auVar45,*(undefined1 (*) [32])(local_2780.hit + 0x80));
                    *(undefined1 (*) [32])(local_2780.ray + 0x200) = auVar43;
                    auVar43 = vpmaskmovd_avx2(auVar45,*(undefined1 (*) [32])(local_2780.hit + 0xa0))
                    ;
                    *(undefined1 (*) [32])(local_2780.ray + 0x220) = auVar43;
                    auVar43 = vpmaskmovd_avx2(auVar45,*(undefined1 (*) [32])(local_2780.hit + 0xc0))
                    ;
                    *(undefined1 (*) [32])(local_2780.ray + 0x240) = auVar43;
                    auVar43 = vpmaskmovd_avx2(auVar45,*(undefined1 (*) [32])(local_2780.hit + 0xe0))
                    ;
                    *(undefined1 (*) [32])(local_2780.ray + 0x260) = auVar43;
                    auVar43 = vpmaskmovd_avx2(auVar45,*(undefined1 (*) [32])(local_2780.hit + 0x100)
                                             );
                    *(undefined1 (*) [32])(local_2780.ray + 0x280) = auVar43;
                  }
                }
                if ((((((((auVar9 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar9 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar9 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar9 >> 0x7f,0) == '\0') &&
                      (auVar9 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar9 >> 0xbf,0) == '\0') &&
                    (auVar9 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar9[0x1f]) {
                  *(int *)(ray + k * 4 + 0x100) = auVar76._0_4_;
                }
                else {
                  auVar76 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                }
                *(undefined4 *)(local_27a0 + local_27c0._0_8_ * 4) = 0;
                uVar15 = auVar76._0_4_;
                auVar34._4_4_ = uVar15;
                auVar34._0_4_ = uVar15;
                auVar34._8_4_ = uVar15;
                auVar34._12_4_ = uVar15;
                auVar36 = vcmpps_avx(auVar35._0_16_,auVar34,2);
                local_27a0 = vandps_avx(auVar36,local_27a0);
                uVar16 = local_27c0._0_8_;
                lVar25 = local_2830;
              }
              if ((((local_27a0 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (local_27a0 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (local_27a0 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < local_27a0[0xf]) break;
              auVar42._8_4_ = 0x7f800000;
              auVar42._0_8_ = 0x7f8000007f800000;
              auVar42._12_4_ = 0x7f800000;
              auVar36 = vblendvps_avx(auVar42,auVar35._0_16_,local_27a0);
              auVar46 = vshufps_avx(auVar36,auVar36,0xb1);
              auVar46 = vminps_avx(auVar46,auVar36);
              auVar54 = vshufpd_avx(auVar46,auVar46,1);
              auVar46 = vminps_avx(auVar54,auVar46);
              auVar46 = vcmpps_avx(auVar36,auVar46,0);
              auVar54 = local_27a0 & auVar46;
              auVar36 = local_27a0;
              if ((((auVar54 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar54[0xf] < '\0') {
                auVar36 = vandps_avx(auVar46,local_27a0);
              }
              uVar15 = vmovmskps_avx(auVar36);
              lVar23 = 0;
              for (uVar16 = CONCAT44((int)(uVar16 >> 0x20),uVar15); (uVar16 & 1) == 0;
                  uVar16 = uVar16 >> 1 | 0x8000000000000000) {
                lVar23 = lVar23 + 1;
              }
            } while( true );
          }
        }
      }
      auVar80 = ZEXT3264(local_24e0);
      auVar82 = ZEXT3264(local_2500);
      auVar83 = ZEXT3264(local_2520);
      auVar76 = ZEXT3264(local_26a0);
      fVar84 = local_2540;
      fVar88 = fStack_253c;
      fVar89 = fStack_2538;
      fVar90 = fStack_2534;
      fVar91 = fStack_2530;
      fVar92 = fStack_252c;
      fVar93 = fStack_2528;
      fVar94 = local_2560;
      fVar106 = fStack_255c;
      fVar110 = fStack_2558;
      fVar112 = fStack_2554;
      fVar114 = fStack_2550;
      fVar96 = fStack_254c;
      fVar97 = fStack_2548;
      fVar98 = local_2580;
      fVar99 = fStack_257c;
      fVar100 = fStack_2578;
      fVar101 = fStack_2574;
      fVar102 = fStack_2570;
      fVar103 = fStack_256c;
      fVar104 = fStack_2568;
      fVar105 = local_25a0;
      fVar109 = fStack_259c;
      fVar111 = fStack_2598;
      fVar113 = fStack_2594;
      fVar115 = fStack_2590;
      fVar116 = fStack_258c;
      fVar117 = fStack_2588;
      fVar118 = local_25c0;
      fVar121 = fStack_25bc;
      fVar122 = fStack_25b8;
      fVar123 = fStack_25b4;
      fVar124 = fStack_25b0;
      fVar125 = fStack_25ac;
      fVar126 = fStack_25a8;
      fVar127 = local_25e0;
      fVar128 = fStack_25dc;
      fVar129 = fStack_25d8;
      fVar130 = fStack_25d4;
      fVar131 = fStack_25d0;
      fVar132 = fStack_25cc;
      fVar133 = fStack_25c8;
    }
    uVar15 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar35 = ZEXT3264(CONCAT428(uVar15,CONCAT424(uVar15,CONCAT420(uVar15,CONCAT416(uVar15,CONCAT412
                                                  (uVar15,CONCAT48(uVar15,CONCAT44(uVar15,uVar15))))
                                                  ))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }